

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.hpp
# Opt level: O0

ostream * operator<<(ostream *os,
                    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *property)

{
  __tuple_element_t<0UL,_tuple<basic_string<char>,_basic_string<char>_>_> *p_Var1;
  ostream *poVar2;
  __tuple_element_t<1UL,_tuple<basic_string<char>,_basic_string<char>_>_> *p_Var3;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *property_local;
  ostream *os_local;
  
  p_Var1 = std::get<0ul,std::__cxx11::string,std::__cxx11::string>(property);
  poVar2 = std::operator<<(os,(string *)p_Var1);
  poVar2 = std::operator<<(poVar2," = ");
  p_Var3 = std::get<1ul,std::__cxx11::string,std::__cxx11::string>(property);
  std::operator<<(poVar2,(string *)p_Var3);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const std::tuple<std::string, std::string> &property) {
  os << std::get<0>(property) << " = " << std::get<1>(property);
  return os;
}